

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::retrain(FastText *this,Args *args)

{
  Model *this_00;
  int local_34;
  
  std::make_shared<fasttext::Args,fasttext::Args_const&>((Args *)&stack0xffffffffffffffd0);
  std::__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
      == sup) {
    local_34 = Dictionary::nlabels((this->dict_).
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
  }
  else {
    local_34 = Dictionary::nwords((this->dict_).
                                  super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
  }
  std::make_shared<fasttext::Matrix,int,int&>((int *)&stack0xffffffffffffffd0,&local_34);
  std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  Matrix::zero((this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  startThreads(this);
  local_34 = 0;
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
            ((shared_ptr<fasttext::Matrix> *)&stack0xffffffffffffffd0,&this->input_,&this->output_,
             (shared_ptr<fasttext::Args> *)&this->weights_,(int *)this);
  std::__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  this_00 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
      == sup) {
    Dictionary::getCounts
              ((vector<long,_std::allocator<long>_> *)&stack0xffffffffffffffd0,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,label);
    Model::setTargetCounts(this_00,(vector<long,_std::allocator<long>_> *)&stack0xffffffffffffffd0);
  }
  else {
    Dictionary::getCounts
              ((vector<long,_std::allocator<long>_> *)&stack0xffffffffffffffd0,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,word);
    Model::setTargetCounts(this_00,(vector<long,_std::allocator<long>_> *)&stack0xffffffffffffffd0);
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void FastText::retrain(const Args& args)
{	
	args_ = std::make_shared<Args>(args);
	if (args_->model == model_name::sup) {
		output_ = std::make_shared<Matrix>(dict_->nlabels(), args_->dim);
	} else {
		output_ = std::make_shared<Matrix>(dict_->nwords(), args_->dim);
	}
	output_->zero();
	startThreads();
	model_ = std::make_shared<Model>(input_, output_, weights_, args_, 0);
	if (args_->model == model_name::sup) {
		model_->setTargetCounts(dict_->getCounts(entry_type::label));
	} else {
		model_->setTargetCounts(dict_->getCounts(entry_type::word));
	}
}